

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateTypeidMemberAccess
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,SynIdentifier *member)

{
  TypeBase *pTVar1;
  TypeStruct *pTVar2;
  bool bVar3;
  uint uVar4;
  ExpressionContext *pEVar5;
  TypeBase *pTVar6;
  ExprTypeLiteral *pEVar7;
  ExprBase *pEVar8;
  TypeMemberSet *this;
  ExprIntegerLiteral *pEVar9;
  ExprError *pEVar10;
  TypeArgumentSet *pTVar11;
  bool local_229;
  TypeArgumentSet *argumentsType_2;
  TypeArgumentSet *local_190;
  TypeArgumentSet *argumentsType_1;
  TypeUnsizedArray *local_178;
  TypeUnsizedArray *arrType_2;
  TypeArray *arrType_1;
  TypeRef *refType;
  TypeFunction *local_150;
  TypeFunction *functionType_1;
  TypeHandle *local_138;
  TypeHandle *local_130;
  TypeHandle *local_128;
  TypeHandle *local_120;
  InplaceStr local_118;
  TypeFunction *local_108;
  TypeFunction *functionType;
  TypeArgumentSet *local_f0;
  TypeArgumentSet *argumentsType;
  TypeArray *local_d8;
  TypeArray *arrType;
  InplaceStr local_c0;
  InplaceStr local_b0;
  InplaceStr local_a0;
  SynIdentifier *local_90;
  SynIdentifier *curr_4;
  TypeGenericClass *typeGenericClass;
  InplaceStr local_70;
  SynBase *local_60;
  ConstantData *curr_3;
  MemberHandle *curr_2;
  TypeStruct *structType;
  MatchData *curr_1;
  MatchData *curr;
  TypeClass *classType;
  SynIdentifier *member_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  classType = (TypeClass *)member;
  member_local = (SynIdentifier *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)ctx;
  if (member == (SynIdentifier *)0x0) {
    pEVar5 = (ExpressionContext *)ExpressionContext::get<ExprErrorTypeMemberAccess>(ctx);
    pTVar1 = type_local;
    pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
    ExprErrorTypeMemberAccess::ExprErrorTypeMemberAccess
              ((ExprErrorTypeMemberAccess *)pEVar5,(SynBase *)pTVar1,pTVar6,(TypeBase *)member_local
              );
    ctx_local = pEVar5;
  }
  else {
    curr = (MatchData *)getType<TypeClass>(type);
    if ((TypeClass *)curr != (TypeClass *)0x0) {
      for (curr_1 = (((TypeClass *)curr)->aliases).head; curr_1 != (MatchData *)0x0;
          curr_1 = curr_1->next) {
        bVar3 = InplaceStr::operator==
                          (&curr_1->name->name,
                           (InplaceStr *)&(classType->super_TypeStruct).super_TypeBase.refType);
        if (bVar3) {
          pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
          ExprTypeLiteral::ExprTypeLiteral
                    (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                     curr_1->type);
          return &pEVar7->super_ExprBase;
        }
      }
      for (structType = (TypeStruct *)curr[7].next; structType != (TypeStruct *)0x0;
          structType = (TypeStruct *)(structType->super_TypeBase).name.begin) {
        bVar3 = InplaceStr::operator==
                          ((InplaceStr *)((structType->super_TypeBase)._vptr_TypeBase + 8),
                           (InplaceStr *)&(classType->super_TypeStruct).super_TypeBase.refType);
        if (bVar3) {
          pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
          ExprTypeLiteral::ExprTypeLiteral
                    (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                     *(TypeBase **)&(structType->super_TypeBase).typeID);
          return &pEVar7->super_ExprBase;
        }
      }
    }
    curr_2 = (MemberHandle *)getType<TypeStruct>((TypeBase *)member_local);
    if ((TypeStruct *)curr_2 != (TypeStruct *)0x0) {
      for (curr_3 = (ConstantData *)(((TypeStruct *)curr_2)->members).head;
          curr_3 != (ConstantData *)0x0; curr_3 = *(ConstantData **)&curr_3->listed) {
        bVar3 = InplaceStr::operator==
                          ((InplaceStr *)(*(long *)&curr_3->value->listed + 0x40),
                           (InplaceStr *)&(classType->super_TypeStruct).super_TypeBase.refType);
        if (bVar3) {
          pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
          ExprTypeLiteral::ExprTypeLiteral
                    (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                     (TypeBase *)curr_3->value->next);
          return &pEVar7->super_ExprBase;
        }
      }
      for (local_60 = curr_2[3].source; local_60 != (SynBase *)0x0;
          local_60 = (SynBase *)local_60->begin) {
        bVar3 = InplaceStr::operator==
                          ((InplaceStr *)(local_60->_vptr_SynBase + 8),
                           (InplaceStr *)&(classType->super_TypeStruct).super_TypeBase.refType);
        if (bVar3) {
          pEVar8 = CreateLiteralCopy((ExpressionContext *)source_local,(SynBase *)type_local,
                                     *(ExprBase **)&local_60->typeID);
          return pEVar8;
        }
      }
      pTVar2 = &classType->super_TypeStruct;
      InplaceStr::InplaceStr(&local_70,"hasMember");
      bVar3 = InplaceStr::operator==((InplaceStr *)&(pTVar2->super_TypeBase).refType,&local_70);
      if (bVar3) {
        pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
        pTVar6 = type_local;
        pTVar1 = *(TypeBase **)&source_local[0x227].listed;
        this = ExpressionContext::get<TypeMemberSet>((ExpressionContext *)source_local);
        _typeGenericClass =
             GetMemberSetTypeName((ExpressionContext *)source_local,(TypeBase *)curr_2);
        TypeMemberSet::TypeMemberSet(this,_typeGenericClass,(TypeStruct *)curr_2);
        ExprTypeLiteral::ExprTypeLiteral(pEVar7,(SynBase *)pTVar6,pTVar1,&this->super_TypeBase);
        return &pEVar7->super_ExprBase;
      }
    }
    curr_4 = (SynIdentifier *)getType<TypeGenericClass>((TypeBase *)member_local);
    if ((TypeGenericClass *)curr_4 != (TypeGenericClass *)0x0) {
      for (local_90 = (((TypeGenericClass *)curr_4)->proto->definition->aliases).head;
          local_90 != (SynIdentifier *)0x0;
          local_90 = getType<SynIdentifier>((local_90->super_SynBase).next)) {
        bVar3 = InplaceStr::operator==
                          (&local_90->name,
                           (InplaceStr *)&(classType->super_TypeStruct).super_TypeBase.refType);
        if (bVar3) {
          pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
          ExprTypeLiteral::ExprTypeLiteral
                    (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                     (TypeBase *)source_local[0x228].begin);
          return &pEVar7->super_ExprBase;
        }
      }
    }
    pTVar2 = &classType->super_TypeStruct;
    InplaceStr::InplaceStr(&local_a0,"isReference");
    bVar3 = InplaceStr::operator==((InplaceStr *)&(pTVar2->super_TypeBase).refType,&local_a0);
    if (bVar3) {
      pEVar5 = (ExpressionContext *)
               ExpressionContext::get<ExprBoolLiteral>((ExpressionContext *)source_local);
      pTVar6 = type_local;
      pTVar1 = (TypeBase *)source_local[0x227]._vptr_SynBase;
      bVar3 = isType<TypeRef>((TypeBase *)member_local);
      ExprBoolLiteral::ExprBoolLiteral((ExprBoolLiteral *)pEVar5,(SynBase *)pTVar6,pTVar1,bVar3);
      ctx_local = pEVar5;
    }
    else {
      pTVar2 = &classType->super_TypeStruct;
      InplaceStr::InplaceStr(&local_b0,"isArray");
      bVar3 = InplaceStr::operator==((InplaceStr *)&(pTVar2->super_TypeBase).refType,&local_b0);
      if (bVar3) {
        pEVar5 = (ExpressionContext *)
                 ExpressionContext::get<ExprBoolLiteral>((ExpressionContext *)source_local);
        pTVar6 = type_local;
        pTVar1 = (TypeBase *)source_local[0x227]._vptr_SynBase;
        bVar3 = isType<TypeArray>((TypeBase *)member_local);
        local_229 = true;
        if (!bVar3) {
          local_229 = isType<TypeUnsizedArray>((TypeBase *)member_local);
        }
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar5,(SynBase *)pTVar6,pTVar1,local_229);
        ctx_local = pEVar5;
      }
      else {
        pTVar2 = &classType->super_TypeStruct;
        InplaceStr::InplaceStr(&local_c0,"isFunction");
        bVar3 = InplaceStr::operator==((InplaceStr *)&(pTVar2->super_TypeBase).refType,&local_c0);
        if (bVar3) {
          pEVar5 = (ExpressionContext *)
                   ExpressionContext::get<ExprBoolLiteral>((ExpressionContext *)source_local);
          pTVar6 = type_local;
          pTVar1 = (TypeBase *)source_local[0x227]._vptr_SynBase;
          bVar3 = isType<TypeFunction>((TypeBase *)member_local);
          ExprBoolLiteral::ExprBoolLiteral((ExprBoolLiteral *)pEVar5,(SynBase *)pTVar6,pTVar1,bVar3)
          ;
          ctx_local = pEVar5;
        }
        else {
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&arrType,"arraySize");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,(InplaceStr *)&arrType)
          ;
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            local_d8 = getType<TypeArray>((TypeBase *)member_local);
            if (local_d8 != (TypeArray *)0x0) {
              pEVar9 = ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)source_local)
              ;
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar9,(SynBase *)type_local,(TypeBase *)source_local[0x227].end,
                         local_d8->length);
              return &pEVar9->super_ExprBase;
            }
            bVar3 = isType<TypeUnsizedArray>((TypeBase *)member_local);
            if (bVar3) {
              pEVar9 = ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)source_local)
              ;
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar9,(SynBase *)type_local,(TypeBase *)source_local[0x227].end,-1);
              return &pEVar9->super_ExprBase;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'arraySize\' can only be applied to an array type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&argumentsType,"size");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,
                             (InplaceStr *)&argumentsType);
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            local_f0 = getType<TypeArgumentSet>((TypeBase *)member_local);
            if (local_f0 != (TypeArgumentSet *)0x0) {
              pEVar9 = ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)source_local)
              ;
              pTVar6 = type_local;
              pTVar1 = (TypeBase *)source_local[0x227].end;
              uVar4 = IntrusiveList<TypeHandle>::size(&local_f0->types);
              ExprIntegerLiteral::ExprIntegerLiteral(pEVar9,(SynBase *)pTVar6,pTVar1,(ulong)uVar4);
              return &pEVar9->super_ExprBase;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'size\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&functionType,"argument");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,
                             (InplaceStr *)&functionType);
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            local_108 = getType<TypeFunction>((TypeBase *)member_local);
            if (local_108 != (TypeFunction *)0x0) {
              pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
              pTVar6 = type_local;
              pTVar1 = *(TypeBase **)&source_local[0x227].listed;
              pTVar11 = ExpressionContext::get<TypeArgumentSet>((ExpressionContext *)source_local);
              local_128 = (local_108->arguments).head;
              local_120 = (local_108->arguments).tail;
              local_118 = GetArgumentSetTypeName
                                    ((ExpressionContext *)source_local,local_108->arguments);
              local_138 = (local_108->arguments).head;
              local_130 = (local_108->arguments).tail;
              TypeArgumentSet::TypeArgumentSet(pTVar11,local_118,local_108->arguments);
              ExprTypeLiteral::ExprTypeLiteral
                        (pEVar7,(SynBase *)pTVar6,pTVar1,&pTVar11->super_TypeBase);
              return &pEVar7->super_ExprBase;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'argument\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&functionType_1,"return");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,
                             (InplaceStr *)&functionType_1);
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            local_150 = getType<TypeFunction>((TypeBase *)member_local);
            if (local_150 != (TypeFunction *)0x0) {
              pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
              ExprTypeLiteral::ExprTypeLiteral
                        (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                         local_150->returnType);
              return &pEVar7->super_ExprBase;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'return\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&refType,"target");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,(InplaceStr *)&refType)
          ;
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            arrType_1 = (TypeArray *)getType<TypeRef>((TypeBase *)member_local);
            if (arrType_1 != (TypeArray *)0x0) {
              pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
              ExprTypeLiteral::ExprTypeLiteral
                        (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                         arrType_1->subType);
              return &pEVar7->super_ExprBase;
            }
            arrType_2 = (TypeUnsizedArray *)getType<TypeArray>((TypeBase *)member_local);
            if (arrType_2 != (TypeUnsizedArray *)0x0) {
              pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
              ExprTypeLiteral::ExprTypeLiteral
                        (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                         (TypeBase *)(arrType_2->super_TypeStruct).typeScope);
              return &pEVar7->super_ExprBase;
            }
            local_178 = getType<TypeUnsizedArray>((TypeBase *)member_local);
            if (local_178 != (TypeUnsizedArray *)0x0) {
              pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
              ExprTypeLiteral::ExprTypeLiteral
                        (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                         local_178->subType);
              return &pEVar7->super_ExprBase;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'target\' can only be applied to a pointer or array type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&argumentsType_1,"first");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,
                             (InplaceStr *)&argumentsType_1);
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            local_190 = getType<TypeArgumentSet>((TypeBase *)member_local);
            if (local_190 != (TypeArgumentSet *)0x0) {
              bVar3 = IntrusiveList<TypeHandle>::empty(&local_190->types);
              if (!bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
                ExprTypeLiteral::ExprTypeLiteral
                          (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                           ((local_190->types).head)->type);
                return &pEVar7->super_ExprBase;
              }
              anon_unknown.dwarf_8df1c::Report
                        ((ExpressionContext *)source_local,(SynBase *)type_local,
                         "ERROR: function argument set is empty");
              return (ExprBase *)0x0;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'first\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          pTVar2 = &classType->super_TypeStruct;
          InplaceStr::InplaceStr((InplaceStr *)&argumentsType_2,"last");
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&(pTVar2->super_TypeBase).refType,
                             (InplaceStr *)&argumentsType_2);
          if (bVar3) {
            bVar3 = isType<TypeError>((TypeBase *)member_local);
            if (bVar3) {
              pEVar10 = ExpressionContext::get<ExprError>((ExpressionContext *)source_local);
              pTVar1 = type_local;
              pTVar6 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->
                        super_TypeBase;
              ExprError::ExprError(pEVar10,(SynBase *)pTVar1,pTVar6);
              return &pEVar10->super_ExprBase;
            }
            pTVar11 = getType<TypeArgumentSet>((TypeBase *)member_local);
            if (pTVar11 != (TypeArgumentSet *)0x0) {
              bVar3 = IntrusiveList<TypeHandle>::empty(&pTVar11->types);
              if (!bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
                ExprTypeLiteral::ExprTypeLiteral
                          (pEVar7,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
                           ((pTVar11->types).tail)->type);
                return &pEVar7->super_ExprBase;
              }
              anon_unknown.dwarf_8df1c::Report
                        ((ExpressionContext *)source_local,(SynBase *)type_local,
                         "ERROR: function argument set is empty");
              return (ExprBase *)0x0;
            }
            anon_unknown.dwarf_8df1c::Report
                      ((ExpressionContext *)source_local,(SynBase *)type_local,
                       "ERROR: \'last\' can only be applied to a function type, but we have \'%.*s\'"
                       ,(ulong)(uint)((int)(member_local->super_SynBase).end -
                                     (int)(member_local->super_SynBase).begin),
                       (member_local->super_SynBase).begin);
          }
          ctx_local = (ExpressionContext *)0x0;
        }
      }
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateTypeidMemberAccess(ExpressionContext &ctx, SynBase *source, TypeBase *type, SynIdentifier *member)
{
	if(!member)
		return new (ctx.get<ExprErrorTypeMemberAccess>()) ExprErrorTypeMemberAccess(source, ctx.GetErrorType(), type);

	if(TypeClass *classType = getType<TypeClass>(type))
	{
		for(MatchData *curr = classType->aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name== member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}

		for(MatchData *curr = classType->generics.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}
	}

	if(TypeStruct *structType = getType<TypeStruct>(type))
	{
		for(MemberHandle *curr = structType->members.head; curr; curr = curr->next)
		{
			if(curr->variable->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->variable->type);
		}

		for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return CreateLiteralCopy(ctx, source, curr->value);
		}

		if(member->name == InplaceStr("hasMember"))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeMemberSet>()) TypeMemberSet(GetMemberSetTypeName(ctx, structType), structType));
	}

	if(TypeGenericClass *typeGenericClass = getType<TypeGenericClass>(type))
	{
		for(SynIdentifier *curr = typeGenericClass->proto->definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(curr->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, ctx.typeGeneric);
		}
	}

	if(member->name == InplaceStr("isReference"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeRef>(type));
	}

	if(member->name == InplaceStr("isArray"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeArray>(type) || isType<TypeUnsizedArray>(type));
	}

	if(member->name == InplaceStr("isFunction"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeFunction>(type));
	}

	if(member->name == InplaceStr("arraySize"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, arrType->length);

		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, -1);

		Report(ctx, source, "ERROR: 'arraySize' can only be applied to an array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("size"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, argumentsType->types.size());

		Report(ctx, source, "ERROR: 'size' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("argument"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeArgumentSet>()) TypeArgumentSet(GetArgumentSetTypeName(ctx, functionType->arguments), functionType->arguments));

		Report(ctx, source, "ERROR: 'argument' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("return"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, functionType->returnType);

		Report(ctx, source, "ERROR: 'return' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("target"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeRef *refType = getType<TypeRef>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, refType->subType);

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		Report(ctx, source, "ERROR: 'target' can only be applied to a pointer or array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("first"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.head->type);
		}

		Report(ctx, source, "ERROR: 'first' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("last"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.tail->type);
		}

		Report(ctx, source, "ERROR: 'last' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	return NULL;
}